

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxy_connect(Curl_easy *data,int sockindex)

{
  connectdata *conn_00;
  CURLcode CVar1;
  uint uVar2;
  CURLcode CVar3;
  long lVar4;
  long lVar5;
  _Bool *done;
  connectdata *conn;
  
  conn_00 = data->conn;
  if ((conn_00->http_proxy).proxytype == CURLPROXY_HTTPS) {
    done = (conn_00->bits).proxy_ssl_connected + sockindex;
    CVar3 = CURLE_OK;
    if ((*done == false) &&
       (CVar1 = Curl_ssl_connect_nonblocking(data,conn_00,true,sockindex,done), CVar1 != CURLE_OK))
    {
      Curl_conncontrol(conn_00,1);
      CVar3 = CVar1;
    }
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (*done != true) {
      return CURLE_OK;
    }
  }
  uVar2 = (uint)*(undefined8 *)&(conn_00->bits).field_0x4;
  if ((~uVar2 & 9) == 0) {
    lVar5 = 0xa0;
    if (sockindex == 1) {
      lVar5 = 0xb8;
    }
    lVar4 = 0xd0;
    if ((uVar2 >> 8 & 1) == 0) {
      lVar4 = lVar5;
    }
    if (sockindex == 1) {
      uVar2 = (uint)conn_00->secondary_port;
    }
    else if ((uVar2 >> 9 & 1) == 0) {
      uVar2 = conn_00->remote_port;
    }
    else {
      uVar2 = conn_00->conn_to_port;
    }
    CVar3 = Curl_proxyCONNECT(data,sockindex,*(char **)((conn_00->chunk).hexbuffer + lVar4 + -0x3d),
                              uVar2);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    (*Curl_cfree)((data->state).aptr.proxyuserpwd);
    (data->state).aptr.proxyuserpwd = (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxy_connect(struct Curl_easy *data, int sockindex)
{
  struct connectdata *conn = data->conn;
  if(conn->http_proxy.proxytype == CURLPROXY_HTTPS) {
    const CURLcode result = https_proxy_connect(data, sockindex);
    if(result)
      return result;
    if(!conn->bits.proxy_ssl_connected[sockindex])
      return result; /* wait for HTTPS proxy SSL initialization to complete */
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for [protocol] tunneled through HTTP proxy */
    const char *hostname;
    int remote_port;
    CURLcode result;

    /* We want "seamless" operations through HTTP proxy tunnel */

    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */

    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else if(sockindex == SECONDARYSOCKET)
      hostname = conn->secondaryhostname;
    else
      hostname = conn->host.name;

    if(sockindex == SECONDARYSOCKET)
      remote_port = conn->secondary_port;
    else if(conn->bits.conn_to_port)
      remote_port = conn->conn_to_port;
    else
      remote_port = conn->remote_port;

    result = Curl_proxyCONNECT(data, sockindex, hostname, remote_port);
    if(CURLE_OK != result)
      return result;
    Curl_safefree(data->state.aptr.proxyuserpwd);
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  /* no HTTP tunnel proxy, just return */
  return CURLE_OK;
}